

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTS_engine.c
# Opt level: O2

void HTS_Engine_save_riff(HTS_Engine *engine,FILE *fp)

{
  HTS_GStreamSet *gss;
  size_t sVar1;
  ulong sample_index;
  double dVar2;
  short temp;
  short data_35_36;
  short data_33_34;
  short data_23_24;
  short data_21_22;
  int data_41_44;
  char data_37_40 [4];
  int data_29_32;
  int data_25_28;
  int data_17_20;
  char data_13_16 [4];
  char data_09_12 [4];
  int data_05_08;
  char data_01_04 [4];
  
  gss = &engine->gss;
  builtin_strncpy(data_01_04,"RIFF",4);
  sVar1 = HTS_GStreamSet_get_total_nsamples(gss);
  data_05_08 = (int)sVar1 * 2 + 0x24;
  builtin_strncpy(data_09_12,"WAVE",4);
  builtin_strncpy(data_13_16,"fmt ",4);
  data_17_20 = 0x10;
  data_21_22 = 1;
  data_23_24 = 1;
  data_25_28 = (int)(engine->condition).sampling_frequency;
  data_29_32 = data_25_28 * 2;
  data_33_34 = 2;
  data_35_36 = 0x10;
  builtin_strncpy(data_37_40,"data",4);
  sVar1 = HTS_GStreamSet_get_total_nsamples(gss);
  data_41_44 = (int)sVar1 * 2;
  HTS_fwrite_little_endian(data_01_04,1,4,fp);
  HTS_fwrite_little_endian(&data_05_08,4,1,fp);
  HTS_fwrite_little_endian(data_09_12,1,4,fp);
  HTS_fwrite_little_endian(data_13_16,1,4,fp);
  HTS_fwrite_little_endian(&data_17_20,4,1,fp);
  HTS_fwrite_little_endian(&data_21_22,2,1,fp);
  HTS_fwrite_little_endian(&data_23_24,2,1,fp);
  HTS_fwrite_little_endian(&data_25_28,4,1,fp);
  HTS_fwrite_little_endian(&data_29_32,4,1,fp);
  HTS_fwrite_little_endian(&data_33_34,2,1,fp);
  HTS_fwrite_little_endian(&data_35_36,2,1,fp);
  HTS_fwrite_little_endian(data_37_40,1,4,fp);
  HTS_fwrite_little_endian(&data_41_44,4,1,fp);
  sample_index = 0;
  while( true ) {
    sVar1 = HTS_GStreamSet_get_total_nsamples(gss);
    if (sVar1 <= sample_index) break;
    dVar2 = HTS_GStreamSet_get_speech(gss,sample_index);
    if (dVar2 <= 32767.0) {
      if (-32768.0 <= dVar2) {
        temp = (short)(int)dVar2;
      }
      else {
        temp = -0x8000;
      }
    }
    else {
      temp = 0x7fff;
    }
    HTS_fwrite_little_endian(&temp,2,1,fp);
    sample_index = sample_index + 1;
  }
  return;
}

Assistant:

void HTS_Engine_save_riff(HTS_Engine * engine, FILE * fp)
{
   size_t i;
   double x;
   short temp;

   HTS_GStreamSet *gss = &engine->gss;
   char data_01_04[] = { 'R', 'I', 'F', 'F' };
   int data_05_08 = HTS_GStreamSet_get_total_nsamples(gss) * sizeof(short) + 36;
   char data_09_12[] = { 'W', 'A', 'V', 'E' };
   char data_13_16[] = { 'f', 'm', 't', ' ' };
   int data_17_20 = 16;
   short data_21_22 = 1;        /* PCM */
   short data_23_24 = 1;        /* monoral */
   int data_25_28 = engine->condition.sampling_frequency;
   int data_29_32 = engine->condition.sampling_frequency * sizeof(short);
   short data_33_34 = sizeof(short);
   short data_35_36 = (short) (sizeof(short) * 8);
   char data_37_40[] = { 'd', 'a', 't', 'a' };
   int data_41_44 = HTS_GStreamSet_get_total_nsamples(gss) * sizeof(short);

   /* write header */
   HTS_fwrite_little_endian(data_01_04, sizeof(char), 4, fp);
   HTS_fwrite_little_endian(&data_05_08, sizeof(int), 1, fp);
   HTS_fwrite_little_endian(data_09_12, sizeof(char), 4, fp);
   HTS_fwrite_little_endian(data_13_16, sizeof(char), 4, fp);
   HTS_fwrite_little_endian(&data_17_20, sizeof(int), 1, fp);
   HTS_fwrite_little_endian(&data_21_22, sizeof(short), 1, fp);
   HTS_fwrite_little_endian(&data_23_24, sizeof(short), 1, fp);
   HTS_fwrite_little_endian(&data_25_28, sizeof(int), 1, fp);
   HTS_fwrite_little_endian(&data_29_32, sizeof(int), 1, fp);
   HTS_fwrite_little_endian(&data_33_34, sizeof(short), 1, fp);
   HTS_fwrite_little_endian(&data_35_36, sizeof(short), 1, fp);
   HTS_fwrite_little_endian(data_37_40, sizeof(char), 4, fp);
   HTS_fwrite_little_endian(&data_41_44, sizeof(int), 1, fp);
   /* write data */
   for (i = 0; i < HTS_GStreamSet_get_total_nsamples(gss); i++) {
      x = HTS_GStreamSet_get_speech(gss, i);
      if (x > 32767.0)
         temp = 32767;
      else if (x < -32768.0)
         temp = -32768;
      else
         temp = (short) x;
      HTS_fwrite_little_endian(&temp, sizeof(short), 1, fp);
   }
}